

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

int __thiscall rapic::client::connect(client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  char *__name;
  char *__service;
  undefined8 uVar4;
  error_category *__ecat;
  int *piVar5;
  time_t tVar6;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filter;
  iterator __end1;
  iterator __begin1;
  filter_store *__range1;
  int flags;
  int ret;
  addrinfo *addr;
  addrinfo hints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee8;
  client *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  error_category *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  error_category *peVar7;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  filter_store *local_70;
  uint local_68;
  int local_64;
  addrinfo *local_60;
  addrinfo local_58;
  sockaddr *local_18;
  string *local_10;
  client *local_8;
  
  iVar8 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_10 = (string *)CONCAT44(in_register_00000034,__fd);
  local_18 = __addr;
  local_8 = this;
  if (this->state_ != disconnected) {
    prVar3 = (runtime_error *)
             __cxa_allocate_exception(0x10,local_10,__addr,CONCAT44(in_register_0000000c,__len));
    std::runtime_error::runtime_error(prVar3,"rapic: connect called while already connected");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)this,local_10);
  std::__cxx11::string::operator=((string *)&this->service_,(string *)__addr);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff00,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff00,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  memset(&local_58,0,0x30);
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_socktype = 1;
  __name = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  local_64 = getaddrinfo(__name,__service,&local_58,&local_60);
  if ((local_64 != 0) || (local_60 == (addrinfo *)0x0)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"rapic: unable to resolve server address");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = socket(local_60->ai_family,local_60->ai_socktype,local_60->ai_protocol);
  this->socket_ = iVar2;
  if (this->socket_ == -1) {
    freeaddrinfo(local_60);
    uVar4 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              ((system_error *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar8,
               in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  local_68 = fcntl(this->socket_,3);
  if (local_68 != 0xffffffff) {
    iVar2 = fcntl(this->socket_,4,(ulong)(local_68 | 0x800));
    if (iVar2 == -1) {
      disconnect(in_stack_fffffffffffffef0);
      freeaddrinfo(local_60);
      __ecat = (error_category *)__cxa_allocate_exception(0x20);
      peVar7 = __ecat;
      piVar5 = __errno_location();
      iVar2 = (int)((ulong)peVar7 >> 0x20);
      iVar8 = *piVar5;
      std::_V2::system_category();
      std::system_error::system_error
                ((system_error *)CONCAT44(iVar8,in_stack_ffffffffffffff10),iVar2,__ecat,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      __cxa_throw(__ecat,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    local_64 = ::connect(this->socket_,local_60->ai_addr,local_60->ai_addrlen);
    if (local_64 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0x73) {
        disconnect(in_stack_fffffffffffffef0);
        freeaddrinfo(local_60);
        uVar4 = __cxa_allocate_exception(0x20);
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        std::_V2::system_category();
        std::system_error::system_error
                  ((system_error *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   iVar8,in_stack_ffffffffffffff00,(char *)CONCAT44(iVar2,in_stack_fffffffffffffef8)
                  );
        __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      this->state_ = in_progress;
    }
    else {
      this->state_ = established;
    }
    freeaddrinfo(local_60);
    tVar6 = time((time_t *)0x0);
    this->last_activity_ = tVar6;
    std::__cxx11::string::assign((string *)&this->wbuffer_);
    local_70 = &this->filters_;
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffee8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_78);
      std::__cxx11::string::append((string *)&this->wbuffer_);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_78);
    }
    return (int)CONCAT71(extraout_var,bVar1);
  }
  disconnect(in_stack_fffffffffffffef0);
  freeaddrinfo(local_60);
  uVar4 = __cxa_allocate_exception(0x20);
  __errno_location();
  std::_V2::system_category();
  std::system_error::system_error
            ((system_error *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar8,
             in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

auto client::connect(std::string address, std::string service) -> void
{
  if (state_ != rapic::connection_state::disconnected)
    throw std::runtime_error{"rapic: connect called while already connected"};

  // store connection details
  address_ = std::move(address);
  service_ = std::move(service);

  // reset connection state
  wcount_ = 0;
  rcount_ = 0;

  // lookupt the host
  addrinfo hints, *addr;
  memset(&hints, 0, sizeof(hints));
  hints.ai_flags = 0;
  hints.ai_family = AF_UNSPEC;
  hints.ai_socktype = SOCK_STREAM;
  int ret = getaddrinfo(address_.c_str(), service_.c_str(), &hints, &addr);
  if (ret != 0 || addr == nullptr)
    throw std::runtime_error{"rapic: unable to resolve server address"};

  // TODO - loop through all addresses?
  if (addr->ai_next)
  {

  }

  // create the socket
  socket_ = socket(addr->ai_family, addr->ai_socktype, addr->ai_protocol);
  if (socket_ == -1)
  {
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: socket creation failed"};
  }

  // set non-blocking I/O
  int flags = fcntl(socket_, F_GETFL);
  if (flags == -1)
  {
    disconnect();
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: failed to read socket flags"};
  }
  if (fcntl(socket_, F_SETFL, flags | O_NONBLOCK) == -1)
  {
    disconnect();
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: failed to set socket flags"};
  }

  // connect to the remote host
  ret = ::connect(socket_, addr->ai_addr, addr->ai_addrlen);
  if (ret < 0)
  {
    if (errno != EINPROGRESS)
    {
      disconnect();
      freeaddrinfo(addr);
      throw std::system_error{errno, std::system_category(), "rapic: failed to establish connection"};
    }
    state_ = rapic::connection_state::in_progress;
  }
  else
    state_ = rapic::connection_state::established;

  // clean up the address list allocated by getaddrinfo
  freeaddrinfo(addr);

  // set the last activity to now so we don't immediately timeout
  last_activity_ = time(NULL);

  // queue up our permanent connection and filter messages for output as soon as we connect
  /* note: since the only things we ever send is the initial connection, the filters and occasional keepalive
   *       messages, we don't bother with complex write buffering.  the buffer is a simple string which will
   *       be empty except for keepalives after the initial connection negotiation. */
  wbuffer_.assign(msg_connect);
  for (auto& filter : filters_)
    wbuffer_.append(filter);
}